

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

PropertyId
Js::JavascriptOperators::OP_InitElemGetter
          (Var object,Var elementName,Var getter,ScriptContext *scriptContext,
          PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  PropertyId propertyId;
  PropertyOperationFlags flags_local;
  ScriptContext *scriptContext_local;
  Var getter_local;
  Var elementName_local;
  Var object_local;
  
  bVar2 = TaggedNumber::Is(object);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1ca4,"(!TaggedNumber::Is(object))","GetMember on a non-object?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = GetPropertyId(elementName,scriptContext);
  pRVar5 = VarTo<Js::RecyclableObject>(object);
  (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
    [0x2d])(pRVar5,(ulong)uVar3,getter,0,0);
  return uVar3;
}

Assistant:

Js::PropertyId JavascriptOperators::OP_InitElemGetter(Var object, Var elementName, Var getter, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(OP_InitElemGetter);
        AssertMsg(!TaggedNumber::Is(object), "GetMember on a non-object?");

        PropertyId propertyId = JavascriptOperators::GetPropertyId(elementName, scriptContext);

        VarTo<RecyclableObject>(object)->SetAccessors(propertyId, getter, nullptr);

        return propertyId;
        JIT_HELPER_END(OP_InitElemGetter);
    }